

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O3

uint __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
::parse_header(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>_>
               *this,iterator *it,format_specs *spec)

{
  type tVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  wchar_t wVar6;
  uint uVar7;
  uint uVar8;
  iterator it_00;
  error_handler eh;
  printf_width_handler<wchar_t> local_50;
  format_arg local_48;
  
  pwVar4 = it->ptr_;
  pwVar3 = it->end_;
  uVar8 = 0xffffffff;
  if ((pwVar4 != pwVar3) && (wVar2 = *pwVar4, (uint)(wVar2 + L'\xffffffd0') < 10)) {
    pwVar4 = pwVar4 + 1;
    if (wVar2 == L'0') {
      it->ptr_ = pwVar4;
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      pwVar5 = pwVar4;
      wVar6 = wVar2;
      do {
        pwVar4 = pwVar5;
        if (0xccccccc < uVar8) {
          it->ptr_ = pwVar4 + -1;
          uVar8 = 0x80000000;
          goto LAB_0013dbb5;
        }
        uVar8 = (wVar6 + uVar8 * 10) - 0x30;
        if (pwVar4 == pwVar3) break;
        wVar6 = *pwVar4;
        pwVar5 = pwVar4 + 1;
      } while ((uint)(wVar6 + L'\xffffffd0') < 10);
      it->ptr_ = pwVar4;
      if ((int)uVar8 < 0) {
LAB_0013dbb5:
        internal::error_handler::on_error((error_handler *)&local_48,"number is too big");
        pwVar4 = it->ptr_;
        pwVar3 = it->end_;
      }
    }
    if ((pwVar4 == pwVar3) || (*pwVar4 != L'$')) {
      if (wVar2 == L'0') {
        (spec->super_align_spec).fill_ = L'0';
      }
      if (uVar8 != 0) {
        (spec->super_align_spec).width_ = uVar8;
        return 0xffffffff;
      }
      uVar8 = 0xffffffff;
    }
    else {
      it->ptr_ = pwVar4 + 1;
    }
  }
  parse_flags(this,spec,it);
  pwVar3 = it->ptr_;
  pwVar4 = it->end_;
  if (pwVar3 != pwVar4) {
    wVar2 = *pwVar3;
    if (wVar2 < L'0') {
      if (wVar2 == L'*') {
        it_00.ptr_ = pwVar3 + 1;
        it->ptr_ = it_00.ptr_;
        it_00.end_ = pwVar4;
        local_50.spec_ = spec;
        get_arg(&local_48,this,it_00,0xffffffff);
        tVar1 = visit_format_arg<fmt::v5::internal::printf_width_handler<wchar_t>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>>>
                          (&local_50,&local_48);
        (spec->super_align_spec).width_ = tVar1;
      }
    }
    else if ((uint)wVar2 < 0x3a) {
      if (wVar2 == L'0') {
        it->ptr_ = pwVar3 + 1;
        uVar7 = 0;
      }
      else {
        uVar7 = 0;
        pwVar3 = pwVar3 + 1;
        do {
          pwVar5 = pwVar3;
          if (0xccccccc < uVar7) {
            it->ptr_ = pwVar5 + -1;
            uVar7 = 0x80000000;
            goto LAB_0013dcca;
          }
          uVar7 = (wVar2 + uVar7 * 10) - 0x30;
          if (pwVar5 == pwVar4) break;
          wVar2 = *pwVar5;
          pwVar3 = pwVar5 + 1;
        } while ((uint)(wVar2 + L'\xffffffd0') < 10);
        it->ptr_ = pwVar5;
        if ((int)uVar7 < 0) {
LAB_0013dcca:
          internal::error_handler::on_error((error_handler *)&local_48,"number is too big");
        }
      }
      (spec->super_align_spec).width_ = uVar7;
    }
  }
  return uVar8;
}

Assistant:

unsigned basic_printf_context<OutputIt, Char, AF>::parse_header(
  iterator &it, format_specs &spec) {
  unsigned arg_index = std::numeric_limits<unsigned>::max();
  char_type c = *it;
  if (c >= '0' && c <= '9') {
    // Parse an argument index (if followed by '$') or a width possibly
    // preceded with '0' flag(s).
    internal::error_handler eh;
    unsigned value = parse_nonnegative_int(it, eh);
    if (*it == '$') {  // value is an argument index
      ++it;
      arg_index = value;
    } else {
      if (c == '0')
        spec.fill_ = '0';
      if (value != 0) {
        // Nonzero value means that we parsed width and don't need to
        // parse it or flags again, so return now.
        spec.width_ = value;
        return arg_index;
      }
    }
  }
  parse_flags(spec, it);
  // Parse width.
  if (*it >= '0' && *it <= '9') {
    internal::error_handler eh;
    spec.width_ = parse_nonnegative_int(it, eh);
  } else if (*it == '*') {
    ++it;
    spec.width_ = visit_format_arg(
          internal::printf_width_handler<char_type>(spec), get_arg(it));
  }
  return arg_index;
}